

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

String * __thiscall kj::_::PromiseBase::trace(String *__return_storage_ptr__,PromiseBase *this)

{
  PromiseNode *pPVar1;
  TraceBuilder *params;
  ArrayPtr<void_*> local_140;
  undefined1 local_130 [8];
  TraceBuilder builder;
  void *space [32];
  PromiseBase *this_local;
  
  memset(&builder.limit,0,0x100);
  ArrayPtr<void*>::ArrayPtr<32ul>((ArrayPtr<void*> *)&local_140,(void *(*) [32])&builder.limit);
  TraceBuilder::TraceBuilder((TraceBuilder *)local_130,local_140);
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->node);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,local_130,0);
  str<kj::_::TraceBuilder&>(__return_storage_ptr__,(kj *)local_130,params);
  return __return_storage_ptr__;
}

Assistant:

kj::String PromiseBase::trace() {
  void* space[32]{};
  TraceBuilder builder(space);
  node->tracePromise(builder, false);
  return kj::str(builder);
}